

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O1

void __thiscall
CCountryFlags::Render
          (CCountryFlags *this,int CountryCode,vec4 *pColor,float x,float y,float w,float h,
          bool AllowBlocked)

{
  float fVar1;
  CCountryFlag *pCVar2;
  IGraphics *pIVar3;
  ITextRender *pIVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined7 in_register_00000009;
  CCountryFlag *pCVar9;
  long in_FS_OFFSET;
  CQuadItem QuadItem;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (CountryCode + 1) % 0x3e9;
  uVar8 = 0;
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar7 = uVar8;
  }
  iVar6 = (this->m_aCountryFlags).
          super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>.
          num_elements;
  uVar7 = (long)this->m_CodeIndexLUT[uVar7] % (long)iVar6;
  if (0 < (int)uVar7) {
    uVar8 = uVar7 & 0xffffffff;
  }
  pCVar2 = (this->m_aCountryFlags).
           super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
           .list;
  pCVar9 = pCVar2 + uVar8;
  if (((int)CONCAT71(in_register_00000009,AllowBlocked) == 0) && (pCVar9->m_Blocked == true)) {
    uVar7 = (long)this->m_CodeIndexLUT[0] % (long)iVar6;
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = uVar7 & 0xffffffff;
    }
    pCVar9 = pCVar2 + uVar8;
  }
  if ((pCVar9->m_Texture).m_Id < 0) {
    if (Render(int,vector4_base<float>const*,float,float,float,float,bool)::s_Cursor == '\0') {
      iVar6 = __cxa_guard_acquire(&Render(int,vector4_base<float>const*,float,float,float,float,bool)
                                   ::s_Cursor);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&Render::s_Cursor,10.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&Render::s_Cursor,&__dso_handle);
        __cxa_guard_release(&Render(int,vector4_base<float>const*,float,float,float,float,bool)::
                             s_Cursor);
      }
    }
    CTextCursor::Reset(&Render::s_Cursor,-1);
    Render::s_Cursor.m_MaxLines = (int)w;
    Render::s_Cursor.m_CursorPos.field_1.y = y + h * 0.5;
    Render::s_Cursor.m_CursorPos.field_0.x = x + w * 0.5;
    Render::s_Cursor.m_Align = 5;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
                (pIVar4,&Render::s_Cursor,pCVar9->m_aCountryCodeString,0xffffffff);
      return;
    }
  }
  else {
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    fVar1 = (pColor->field_3).w;
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              ((pColor->field_0).x * fVar1,(pColor->field_1).y * fVar1,(pColor->field_2).z * fVar1);
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    local_30 = x;
    local_2c = y;
    local_28 = w;
    local_24 = h;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_30,1);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CCountryFlags::Render(int CountryCode, const vec4 *pColor, float x, float y, float w, float h, bool AllowBlocked)
{
	const CCountryFlag *pFlag = GetByCountryCode(CountryCode);
	if(!AllowBlocked && pFlag->m_Blocked)
		pFlag = GetByCountryCode(-1);
	if(pFlag->m_Texture.IsValid())
	{
		Graphics()->TextureSet(pFlag->m_Texture);
		Graphics()->QuadsBegin();
		Graphics()->SetColor(pColor->r*pColor->a, pColor->g*pColor->a, pColor->b*pColor->a, pColor->a);
		IGraphics::CQuadItem QuadItem(x, y, w, h);
		Graphics()->QuadsDrawTL(&QuadItem, 1);
		Graphics()->QuadsEnd();
	}
	else
	{
		static CTextCursor s_Cursor(10.0f);
		s_Cursor.Reset();
		s_Cursor.MoveTo(x+w/2, y+h/2);
		s_Cursor.m_MaxLines = w;
		s_Cursor.m_Align = TEXTALIGN_MC;
		TextRender()->TextOutlined(&s_Cursor, pFlag->m_aCountryCodeString, -1);
	}
}